

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_memory_rw_debug_riscv64
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  hwaddr hVar1;
  MemTxAttrs local_b8;
  int local_b4;
  MemTxAttrs attrs;
  int asidx;
  uint8_t *buf;
  target_ulong page;
  target_ulong l;
  hwaddr phys_addr;
  target_ulong tStack_88;
  _Bool is_write_local;
  target_ulong len_local;
  void *ptr_local;
  target_ulong addr_local;
  CPUState *cpu_local;
  FlatView *fv;
  MemoryRegion_conflict *mr;
  void *ptr_1;
  hwaddr addr1;
  hwaddr l_1;
  MemTxResult result;
  
  _attrs = ptr;
  tStack_88 = len;
  ptr_local = (void *)addr;
  while( true ) {
    if (tStack_88 == 0) {
      return 0;
    }
    hVar1 = cpu_get_phys_page_attrs_debug(cpu,(ulong)ptr_local & 0xfffffffffffff000,&local_b8);
    local_b4 = cpu_asidx_from_attrs(cpu,local_b8);
    if (hVar1 == 0xffffffffffffffff) break;
    page = (((ulong)ptr_local & 0xfffffffffffff000) + 0x1000) - (long)ptr_local;
    if (tStack_88 < page) {
      page = tStack_88;
    }
    hVar1 = ((ulong)ptr_local & 0xfff) + hVar1;
    if (is_write) {
      address_space_write_rom_riscv64(cpu->cpu_ases[local_b4].as,hVar1,local_b8,_attrs,page);
    }
    else {
      address_space_read_full_riscv64(cpu->cpu_ases[local_b4].as,hVar1,local_b8,_attrs,page);
    }
    tStack_88 = tStack_88 - page;
    _attrs = (void *)(page + (long)_attrs);
    ptr_local = (void *)(page + (long)ptr_local);
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}